

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O3

void __thiscall duckdb::GroupedAggregateHashTable::Repartition(GroupedAggregateHashTable *this)

{
  ClientContext *context;
  pointer this_00;
  type new_partitioned_data;
  _func_int **local_20;
  
  AcquirePartitionedData((GroupedAggregateHashTable *)&stack0xffffffffffffffe0);
  this_00 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
            ::operator->((unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                          *)&stack0xffffffffffffffe0);
  context = this->context;
  new_partitioned_data =
       unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
       ::operator*(&this->partitioned_data);
  PartitionedTupleData::Repartition(this_00,context,new_partitioned_data);
  if (local_20 != (_func_int **)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  return;
}

Assistant:

void GroupedAggregateHashTable::Repartition() {
	auto old = AcquirePartitionedData();
	D_ASSERT(old->GetPartitions().size() != partitioned_data->GetPartitions().size());
	old->Repartition(context, *partitioned_data);
}